

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
::
emplace_value<std::piecewise_construct_t_const&,std::tuple<S2BooleanOperation::SourceId_const&>,std::tuple<>>
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
           *this,size_type i,allocator_type *alloc,piecewise_construct_t *args,
          tuple<const_S2BooleanOperation::SourceId_&> *args_1,tuple<> *args_2)

{
  ulong uVar1;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
  bVar2;
  ulong uVar3;
  long lVar4;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *c;
  long lVar5;
  long lVar6;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar3 = (ulong)(byte)this[10];
  if (i <= (long)uVar3) {
    if (i < (long)uVar3) {
      lVar5 = (ulong)((uint)(byte)this[10] * 4) * 3;
      *(undefined4 *)(this + lVar5 + 0x14) = *(undefined4 *)(this + lVar5 + 8);
      *(undefined8 *)(this + lVar5 + 0xc) = *(undefined8 *)(this + lVar5);
      lVar5 = uVar3 - 1;
      if (i < lVar5) {
        lVar4 = uVar3 << 0x20;
        lVar6 = lVar4 + -0x200000000;
        do {
          lVar4 = lVar4 + -0x100000000;
          *(undefined8 *)(this + (lVar4 >> 0x20) * 0xc + 0xc) =
               *(undefined8 *)(this + (lVar6 >> 0x20) * 0xc + 0xc);
          *(undefined4 *)(this + (lVar4 >> 0x20) * 0xc + 0x14) =
               *(undefined4 *)(this + (lVar6 >> 0x20) * 0xc + 0x14);
          lVar5 = lVar5 + -1;
          lVar6 = lVar6 + -0x100000000;
        } while (i < lVar5);
      }
    }
    *(SourceId *)(this + (long)(int)i * 0xc + 0xc) =
         *(args_1->super__Tuple_impl<0UL,_const_S2BooleanOperation::SourceId_&>).
          super__Head_base<0UL,_const_S2BooleanOperation::SourceId_&,_false>._M_head_impl;
    *(undefined4 *)(this + (long)(int)i * 0xc + 0x14) = 0;
    bVar2 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
             )((char)this[10] + 1);
    this[10] = bVar2;
    if (this[0xb] ==
        (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
         )0x0) {
      lVar5 = i + 1;
      uVar3 = (ulong)(byte)bVar2;
      if (lVar5 < (long)(ulong)(byte)bVar2) {
        do {
          uVar1 = uVar3 - 1;
          c = btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
              ::child((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                       *)this,(int)uVar1);
          btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
          ::set_child((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                       *)this,(int)uVar3,c);
          uVar3 = uVar1;
        } while (lVar5 < (long)uVar1);
        btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        ::mutable_child((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                         *)this,(int)lVar5);
        return;
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5d5,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>, Args = <const std::piecewise_construct_t &, std::tuple<const S2BooleanOperation::SourceId &>, std::tuple<>>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                         allocator_type *alloc,
                                         Args &&... args) {
  assert(i <= count());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < count()) {
    value_init(count(), alloc, slot(count() - 1));
    for (size_type j = count() - 1; j > i; --j)
      slot_type::move(alloc, slot(j - 1), slot(j));
    value_destroy(i, alloc);
  }
  value_init(i, alloc, std::forward<Args>(args)...);
  set_count(count() + 1);

  if (!leaf() && count() > i + 1) {
    for (int j = count(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}